

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O0

void __thiscall
EvdevDevice::EvdevDevice
          (EvdevDevice *this,vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *inputs
          )

{
  bool bVar1;
  reference input_00;
  Input *input;
  const_iterator __end1;
  const_iterator __begin1;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *__range1;
  vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *inputs_local;
  EvdevDevice *this_local;
  
  memset(this,0,0x18);
  std::vector<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>::vector(&this->_devices);
  memset(&this->_events,0,0x600);
  this->_numEvents = 0;
  this->_currentEvent = 0;
  this->_currentRole = 0;
  this->_previousDevice = 0;
  __end1 = std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::begin(inputs);
  input = (Input *)std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>::end(inputs)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
                                *)&input);
    if (!bVar1) break;
    input_00 = __gnu_cxx::
               __normal_iterator<const_EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
               ::operator*(&__end1);
    addDevice(this,input_00);
    __gnu_cxx::
    __normal_iterator<const_EvdevDevice::Input_*,_std::vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

EvdevDevice::EvdevDevice(std::vector<Input> const& inputs) :
  _devices(), _events(), _numEvents(0), _currentEvent(0), _currentRole(0), _previousDevice(0)
{
  for(Input const& input : inputs)
  {
    addDevice(input);
  }
}